

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro_expander.cpp
# Opt level: O0

bool skiwi::anon_unknown_26::expand_existing_macros
               (Program *prog,environment_map *env,repl_data *rd,macro_data *md,context *ctxt,
               primitive_map *pm,compiler_options *ops)

{
  bool bVar1;
  undefined1 local_a0 [8];
  macro_expander_visitor mev;
  primitive_map *pm_local;
  context *ctxt_local;
  macro_data *md_local;
  repl_data *rd_local;
  environment_map *env_local;
  Program *prog_local;
  
  mev._88_8_ = pm;
  bVar1 = std::
          vector<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
          ::empty(&md->compiled_macros);
  if (bVar1) {
    prog_local._7_1_ = false;
  }
  else {
    macro_expander_visitor::macro_expander_visitor((macro_expander_visitor *)local_a0);
    mev.p_ctxt = (context *)mev._88_8_;
    mev.super_base_visitor<skiwi::(anonymous_namespace)::macro_expander_visitor>._vptr_base_visitor
         = (_func_int **)md;
    mev.p_md = (macro_data *)ctxt;
    mev.ops._32_8_ = env;
    mev.p_env = (environment_map *)rd;
    memcpy(&mev.p_pm,ops,0x25);
    mev.p_rd._0_1_ = 0;
    visitor<skiwi::Program,_skiwi::(anonymous_namespace)::macro_expander_visitor>::visit
              (prog,(macro_expander_visitor *)local_a0);
    prog_local._7_1_ = (bool)((byte)mev.p_rd & 1);
  }
  return prog_local._7_1_;
}

Assistant:

bool expand_existing_macros(Program& prog, environment_map& env, repl_data& rd, macro_data& md, context& ctxt, const primitive_map& pm, const compiler_options& ops)
    {
    if (!md.compiled_macros.empty())
      {
      macro_expander_visitor mev;
      mev.p_env = &env;
      mev.p_rd = &rd;
      mev.p_ctxt = &ctxt;
      mev.p_md = &md;
      mev.p_pm = &pm;
      mev.ops = ops;
      mev.macros_expanded = false;
      visitor<Program, macro_expander_visitor>::visit(prog, &mev);
      return mev.macros_expanded;
      }
    return false;
    }